

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O3

Program Pass1::run(char *file_name)

{
  TypePointer<VoidType> TVar1;
  VoidType *__tmp;
  Function *pFVar2;
  mapped_type *ppFVar3;
  mapped_type pFVar4;
  mapped_type *ppFVar5;
  Function *extraout_RDX;
  Function *in_RDI;
  Program PVar6;
  FunctionTableKey new_key;
  Program old_program;
  string path;
  FunctionTable function_table;
  FileTable file_table;
  path local_e0;
  Program local_b8;
  key_type local_a8;
  undefined1 local_88 [32];
  _List local_68;
  size_t local_60;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
  local_58;
  char *local_28;
  
  local_b8.first = (Function *)0x0;
  local_b8.last = (Function *)0x0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58._M_impl.super__Rb_tree_header._M_header;
  local_58._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58._M_impl.super__Rb_tree_header._M_header._M_left;
  std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
            (&local_e0,&local_28,auto_format);
  std::filesystem::__cxx11::path::lexically_normal();
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a8,local_88._0_8_,
             (pointer)(local_88._0_8_ + CONCAT44(local_88._12_4_,local_88._8_4_)));
  std::filesystem::__cxx11::path::~path((path *)local_88);
  std::filesystem::__cxx11::path::~path(&local_e0);
  pFVar2 = MoebiusParser::parse_program(local_a8._M_dataplus._M_p,&local_b8);
  ppFVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
                          *)&local_58,&local_a8);
  *ppFVar3 = pFVar2;
  (in_RDI->path)._M_dataplus._M_p = (pointer)0x0;
  (in_RDI->path)._M_string_length = 0;
  local_88._24_8_ = (long)local_88 + 8;
  local_88._8_4_ = _S_red;
  local_88._16_8_ = 0;
  local_60 = 0;
  local_68._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
          )local_88._24_8_;
  ppFVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
                          *)&local_58,&local_a8);
  local_e0._M_pathname._M_dataplus._M_p = (pointer)*ppFVar3;
  local_e0._M_pathname._M_string_length = 0;
  local_e0._M_pathname.field_2._M_allocated_capacity = 0;
  local_e0._M_pathname.field_2._8_8_ = 0;
  pFVar4 = (mapped_type)operator_new(0x60);
  if (TypeInterner::void_type.pointer == (VoidType *)0x0) {
    TypeInterner::void_type.pointer = (VoidType *)operator_new(8);
    ((TypeInterner::void_type.pointer)->super_Type)._vptr_Type = (_func_int **)&PTR__Type_00152550;
  }
  TVar1.pointer = TypeInterner::void_type.pointer;
  (pFVar4->path)._M_dataplus._M_p = (pointer)&(pFVar4->path).field_2;
  (pFVar4->path)._M_string_length = 0;
  (pFVar4->path).field_2._M_local_buf[0] = '\0';
  (pFVar4->block).first = (Expression *)0x0;
  (pFVar4->block).last = (Expression *)0x0;
  pFVar4->arguments = 0;
  (pFVar4->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pFVar4->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pFVar4->argument_types).super__Vector_base<const_Type_*,_std::allocator<const_Type_*>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  pFVar4->return_type = &(TVar1.pointer)->super_Type;
  pFVar4->next_function = (Function *)0x0;
  (in_RDI->path)._M_dataplus._M_p = (pointer)pFVar4;
  (in_RDI->path)._M_string_length = (size_type)pFVar4;
  ppFVar5 = std::
            map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
            ::operator[]((map<Pass1::FunctionTableKey,_Function_*,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
                          *)local_88,(key_type *)&local_e0);
  *ppFVar5 = pFVar4;
  evaluate(&local_b8,(Program *)in_RDI,(FileTable *)&local_58,(FunctionTable *)local_88,
           (FunctionTableKey *)&local_e0,&pFVar4->block,
           (Block *)(local_e0._M_pathname._M_dataplus._M_p + 0x20));
  if ((void *)local_e0._M_pathname._M_string_length != (void *)0x0) {
    operator_delete((void *)local_e0._M_pathname._M_string_length,
                    local_e0._M_pathname.field_2._8_8_ - local_e0._M_pathname._M_string_length);
  }
  std::
  _Rb_tree<Pass1::FunctionTableKey,_std::pair<const_Pass1::FunctionTableKey,_Function_*>,_std::_Select1st<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
  ::~_Rb_tree((_Rb_tree<Pass1::FunctionTableKey,_std::pair<const_Pass1::FunctionTableKey,_Function_*>,_std::_Select1st<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>,_std::less<Pass1::FunctionTableKey>,_std::allocator<std::pair<const_Pass1::FunctionTableKey,_Function_*>_>_>
               *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Function_*>_>_>
  ::~_Rb_tree(&local_58);
  Program::~Program(&local_b8);
  PVar6.last = extraout_RDX;
  PVar6.first = in_RDI;
  return PVar6;
}

Assistant:

static Program run(const char* file_name) {
		Program old_program;
		FileTable file_table;
		const std::string path = std::filesystem::path(file_name).lexically_normal().string();
		file_table[path] = MoebiusParser::parse_program(path.c_str(), &old_program);
		Program new_program;
		FunctionTable function_table;
		FunctionTableKey new_key(file_table[path]);
		Function* new_function = new Function(TypeInterner::get_void_type());
		new_program.add_function(new_function);
		function_table[new_key] = new_function;
		evaluate(&old_program, &new_program, file_table, function_table, new_key, new_function->get_block(), new_key.old_function->get_block());
		return new_program;
	}